

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          uint num_digits,string_view prefix,basic_format_specs<char> *spec,bin_writer<1> f)

{
  ulong uVar1;
  alignment aVar2;
  int iVar3;
  ulong uVar4;
  ulong size;
  align_spec as;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_>::bin_writer<1>_>
  local_48;
  
  local_48.prefix.size_ = prefix.size_;
  local_48.prefix.data_ = prefix.data_;
  uVar1 = num_digits + local_48.prefix.size_;
  local_48.fill = (char_type)(spec->super_align_spec).fill_;
  aVar2 = (spec->super_align_spec).align_;
  if (aVar2 == ALIGN_NUMERIC) {
    uVar4 = (ulong)(spec->super_align_spec).width_;
    size = uVar4;
    if (uVar4 < uVar1) {
      size = uVar1;
    }
    local_48.padding = 0;
    if (uVar1 <= uVar4) {
      local_48.padding = uVar4 - uVar1;
    }
    as.align_ = (spec->super_align_spec).align_;
    as.width_ = (spec->super_align_spec).width_;
    as.fill_ = (spec->super_align_spec).fill_;
  }
  else {
    iVar3 = spec->precision_;
    local_48.padding = 0;
    size = uVar1;
    if ((int)num_digits < iVar3) {
      size = (long)iVar3 + local_48.prefix.size_;
    }
    if ((int)num_digits < iVar3) {
      local_48.padding = (long)iVar3 - (ulong)num_digits;
      local_48.fill = '0';
    }
    as.align_ = (spec->super_align_spec).align_;
    as.width_ = (spec->super_align_spec).width_;
    as.fill_ = (spec->super_align_spec).fill_;
    if (aVar2 == ALIGN_DEFAULT) {
      as.align_ = ALIGN_RIGHT;
    }
  }
  local_48.f = f;
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>>
            (this,size,&as,&local_48);
  return;
}

Assistant:

void write_int(unsigned num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + num_digits;
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision() > static_cast<int>(num_digits)) {
      size = prefix.size() + static_cast<std::size_t>(spec.precision());
      padding = static_cast<std::size_t>(spec.precision()) - num_digits;
      fill = '0';
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(size, as, padded_int_writer<F>{prefix, fill, padding, f});
  }